

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::GetPredefinedTargetsFolder_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this)

{
  cmState *this_00;
  cmValue cVar1;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (this->CMakeInstance->State)._M_t.
            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"PREDEFINED_TARGETS_FOLDER",&local_39);
  cVar1 = cmState::GetGlobalProperty(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (cVar1.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CMakePredefinedTargets",
               (allocator<char> *)&local_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)cVar1.Value);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetPredefinedTargetsFolder() const
{
  cmValue prop = this->GetCMakeInstance()->GetState()->GetGlobalProperty(
    "PREDEFINED_TARGETS_FOLDER");

  if (prop) {
    return *prop;
  }

  return "CMakePredefinedTargets";
}